

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

double __thiscall llvm::APInt::roundToDouble(APInt *this,bool isSigned)

{
  uint64_t uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  anon_union_8_2_1313ab2f_for_U aVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  APInt Tmp;
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  double local_48;
  undefined8 uStack_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  uVar8 = this->BitWidth;
  uVar10 = (ulong)uVar8;
  if ((uVar10 < 0x41) || (uVar4 = countLeadingZerosSlowCase(this), uVar8 - uVar4 < 0x41)) {
    if (0x40 < uVar8) {
      this = (APInt *)(this->U).VAL;
    }
    uVar1 = (this->U).VAL;
    if (!isSigned) {
      auVar11._8_4_ = (int)(uVar1 >> 0x20);
      auVar11._0_8_ = uVar1;
      auVar11._12_4_ = 0x45300000;
      return (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    }
    if (uVar8 == 0) {
      __assert_fail("B > 0 && \"Bit width can\'t be 0.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                    ,0x2f6,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
    }
    if (uVar8 < 0x41) {
      return (double)((long)(uVar1 << (-(char)uVar8 & 0x3fU)) >> (-(char)uVar8 & 0x3fU));
    }
    __assert_fail("B <= 64 && \"Bit width out of range.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                  ,0x2f7,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
  }
  local_50 = uVar8;
  if (isSigned) {
    bVar3 = operator[](this,uVar8 - 1);
    uVar4 = (uint)bVar3;
    uVar8 = this->BitWidth;
    uVar10 = (ulong)uVar8;
    if (bVar3) {
      if (uVar8 < 0x41) {
        aVar5 = (anon_union_8_2_1313ab2f_for_U)(this->U).VAL;
        local_30 = uVar8;
      }
      else {
        uVar10 = (ulong)((uint)(uVar10 + 0x3f >> 3) & 0xfffffff8);
        local_30 = uVar8;
        aVar5.pVal = (uint64_t *)operator_new__(uVar10);
        memcpy(aVar5.pVal,(this->U).pVal,uVar10);
      }
      local_38 = aVar5;
      flipAllBits((APInt *)&local_38);
      operator++((APInt *)&local_38);
      uVar8 = local_30;
      local_50 = local_30;
      local_58.VAL = local_38.VAL;
      local_30 = 0;
      aVar5 = local_38;
      uVar6 = 1;
      if (0x40 < uVar8) goto LAB_001421ab;
    }
    else {
      local_50 = uVar8;
      if (0x40 < uVar8) goto LAB_0014217b;
      aVar5 = (anon_union_8_2_1313ab2f_for_U)(this->U).pVal;
    }
    if ((ulong *)aVar5.VAL == (ulong *)0x0) {
      uVar6 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if ((ulong *)aVar5.VAL != (ulong *)0x0) {
        for (; aVar5.VAL >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar6 = (uint)lVar2 ^ 0x3f;
    }
    uVar6 = (uVar8 - 0x40) + uVar6;
    local_58 = aVar5;
    local_50 = uVar8;
  }
  else {
LAB_0014217b:
    uVar8 = (uint)uVar10;
    uVar10 = (ulong)((uint)(uVar10 + 0x3f >> 3) & 0xfffffff8);
    aVar5.pVal = (uint64_t *)operator_new__(uVar10);
    local_58.pVal = aVar5.pVal;
    memcpy(aVar5.pVal,(this->U).pVal,uVar10);
    uVar6 = 0;
LAB_001421ab:
    uVar4 = uVar6;
    uVar6 = countLeadingZerosSlowCase((APInt *)&local_58);
  }
  uVar6 = uVar8 - uVar6;
  if (uVar6 < 0x400) {
    if (uVar6 - 1 < 0x40) {
      uVar10 = *aVar5.pVal;
      if (0x34 < uVar6) {
        uVar10 = uVar10 >> ((byte)uVar6 - 0x34 & 0x3f);
      }
    }
    else {
      uVar9 = uVar6 - 1 >> 6;
      bVar7 = (byte)uVar6 & 0x3f;
      uVar10 = ((ulong *)(aVar5.VAL - 8))[uVar9] >> (bVar7 + 0xb & 0x3f) |
               aVar5.pVal[uVar9] << (0x34 - bVar7 & 0x3f);
    }
    local_48 = (double)((ulong)(uVar6 + 0x3ff) << 0x34 | (ulong)uVar4 << 0x3f | uVar10);
  }
  else if (((byte)uVar4 & isSigned) == 1) {
    local_48 = -INFINITY;
  }
  else {
    local_48 = INFINITY;
  }
  if ((0x40 < uVar8) && ((ulong *)aVar5.VAL != (ulong *)0x0)) {
    uStack_40 = 0;
    operator_delete__(aVar5.pVal);
  }
  return local_48;
}

Assistant:

double APInt::roundToDouble(bool isSigned) const {

  // Handle the simple case where the value is contained in one uint64_t.
  // It is wrong to optimize getWord(0) to VAL; there might be more than one word.
  if (isSingleWord() || getActiveBits() <= APINT_BITS_PER_WORD) {
    if (isSigned) {
      int64_t sext = SignExtend64(getWord(0), BitWidth);
      return double(sext);
    } else
      return double(getWord(0));
  }

  // Determine if the value is negative.
  bool isNeg = isSigned ? (*this)[BitWidth-1] : false;

  // Construct the absolute value if we're negative.
  APInt Tmp(isNeg ? -(*this) : (*this));

  // Figure out how many bits we're using.
  unsigned n = Tmp.getActiveBits();

  // The exponent (without bias normalization) is just the number of bits
  // we are using. Note that the sign bit is gone since we constructed the
  // absolute value.
  uint64_t exp = n;

  // Return infinity for exponent overflow
  if (exp > 1023) {
    if (!isSigned || !isNeg)
      return std::numeric_limits<double>::infinity();
    else
      return -std::numeric_limits<double>::infinity();
  }
  exp += 1023; // Increment for 1023 bias

  // Number of bits in mantissa is 52. To obtain the mantissa value, we must
  // extract the high 52 bits from the correct words in pVal.
  uint64_t mantissa;
  unsigned hiWord = whichWord(n-1);
  if (hiWord == 0) {
    mantissa = Tmp.U.pVal[0];
    if (n > 52)
      mantissa >>= n - 52; // shift down, we want the top 52 bits.
  } else {
    assert(hiWord > 0 && "huh?");
    uint64_t hibits = Tmp.U.pVal[hiWord] << (52 - n % APINT_BITS_PER_WORD);
    uint64_t lobits = Tmp.U.pVal[hiWord-1] >> (11 + n % APINT_BITS_PER_WORD);
    mantissa = hibits | lobits;
  }

  // The leading bit of mantissa is implicit, so get rid of it.
  uint64_t sign = isNeg ? (1ULL << (APINT_BITS_PER_WORD - 1)) : 0;
  union {
    double D;
    uint64_t I;
  } T;
  T.I = sign | (exp << 52) | mantissa;
  return T.D;
}